

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int test_layer<ncnn::Dropout>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,Mat *a,Mat *top_shape,float epsilon,_func_void_Dropout_ptr *func)

{
  pointer pMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  Dropout *this;
  Option *pOVar16;
  long lVar17;
  void *__dest;
  Mat *__arg;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  ulong uVar18;
  Option opt;
  ModelBinFromMatArray mb;
  Mat local_1a8;
  Mat local_168;
  float local_11c;
  Mat local_118;
  Option local_d8;
  int local_a4;
  ParamDict *local_a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_98;
  void *local_90;
  Mat local_88;
  ModelBinFromMatArray local_40;
  
  pOVar16 = _opt;
  __arg = a;
  local_11c = epsilon;
  local_a4 = typeindex;
  local_a0 = pd;
  local_98 = weights;
  this = (Dropout *)ncnn::create_layer(typeindex);
  iVar15 = (int)pOVar16;
  local_d8.use_int8_arithmetic = _opt->use_int8_arithmetic;
  local_d8.use_packing_layout = _opt->use_packing_layout;
  local_d8.use_shader_pack8 = _opt->use_shader_pack8;
  local_d8.use_bf16_storage = _opt->use_bf16_storage;
  local_d8._36_4_ = *(undefined4 *)&_opt->field_0x24;
  local_d8.lightmode = _opt->lightmode;
  local_d8._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_d8.num_threads = _opt->num_threads;
  local_d8.blob_allocator = _opt->blob_allocator;
  local_d8.workspace_allocator = _opt->workspace_allocator;
  local_d8.use_winograd_convolution = _opt->use_winograd_convolution;
  local_d8.use_sgemm_convolution = _opt->use_sgemm_convolution;
  local_d8.use_int8_inference = _opt->use_int8_inference;
  local_d8.use_vulkan_compute = _opt->use_vulkan_compute;
  local_d8.use_fp16_packed = _opt->use_fp16_packed;
  local_d8.use_fp16_storage = _opt->use_fp16_storage;
  local_d8.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  local_d8.use_int8_storage = _opt->use_int8_storage;
  if (func != (_func_void_Dropout_ptr *)0x0) {
    (*func)(this);
  }
  if ((this->super_Layer).support_vulkan == false) {
    local_d8.use_vulkan_compute = false;
  }
  if ((this->super_Layer).support_packing == false) {
    local_d8.use_packing_layout = false;
  }
  if ((this->super_Layer).support_bf16_storage == false) {
    local_d8.use_bf16_storage = false;
  }
  uVar11 = local_d8._32_8_;
  if (local_d8.use_int8_inference == true) {
    local_d8.use_bf16_storage = false;
    local_d8.use_int8_arithmetic = SUB81(uVar11,0);
    local_d8.use_packing_layout = false;
  }
  if (top_shape->dims != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&(this->super_Layer).bottom_shapes,1)
    ;
    this_00 = &(this->super_Layer).top_shapes;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(this_00,1);
    pMVar1 = (this->super_Layer).bottom_shapes.
             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar1 != a) {
      piVar2 = a->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar1->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->c = 0;
      pMVar1->cstep = 0;
      piVar2 = a->refcount;
      pMVar1->data = a->data;
      pMVar1->refcount = piVar2;
      pMVar1->elemsize = a->elemsize;
      pMVar1->elempack = a->elempack;
      pMVar1->allocator = a->allocator;
      iVar3 = a->w;
      iVar4 = a->h;
      iVar5 = a->c;
      pMVar1->dims = a->dims;
      pMVar1->w = iVar3;
      pMVar1->h = iVar4;
      pMVar1->c = iVar5;
      pMVar1->cstep = a->cstep;
    }
    pMVar1 = (this_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar1 != top_shape) {
      piVar2 = top_shape->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar1->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->c = 0;
      pMVar1->cstep = 0;
      piVar2 = top_shape->refcount;
      pMVar1->data = top_shape->data;
      pMVar1->refcount = piVar2;
      pMVar1->elemsize = top_shape->elemsize;
      pMVar1->elempack = top_shape->elempack;
      pMVar1->allocator = top_shape->allocator;
      iVar3 = top_shape->w;
      iVar4 = top_shape->h;
      iVar5 = top_shape->c;
      pMVar1->dims = top_shape->dims;
      pMVar1->w = iVar3;
      pMVar1->h = iVar4;
      pMVar1->c = iVar5;
      pMVar1->cstep = top_shape->cstep;
    }
  }
  (*(this->super_Layer)._vptr_Layer[2])(this,local_a0);
  ncnn::ModelBinFromMatArray::ModelBinFromMatArray
            (&local_40,
             (local_98->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start);
  (*(this->super_Layer)._vptr_Layer[3])(this,&local_40);
  (*(this->super_Layer)._vptr_Layer[4])(this,&local_d8);
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.c = 0;
  local_88.cstep = 0;
  if ((this->super_Layer).support_inplace == true) {
    ncnn::Mat::clone(&local_118,(__fn *)a,(void *)0x0,iVar15,__arg);
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (**(code **)(*(long *)local_88.allocator + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_88.data = local_118.data;
    local_88.refcount._0_4_ = local_118.refcount._0_4_;
    local_88.refcount._4_4_ = local_118.refcount._4_4_;
    local_88.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_88.elemsize._4_4_ = local_118.elemsize._4_4_;
    local_88.elempack = local_118.elempack;
    local_88.allocator = local_118.allocator;
    uVar11._0_4_ = local_118.dims;
    uVar11._4_4_ = local_118.w;
    local_88.dims = local_118.dims;
    local_88.w = local_118.w;
    uVar12._0_4_ = local_118.h;
    uVar12._4_4_ = local_118.c;
    local_88.h = local_118.h;
    local_88.c = local_118.c;
    local_88.cstep = local_118.cstep;
    uVar13 = uVar11;
    uVar14 = uVar12;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar13 = local_88._40_8_;
      uVar14 = local_88._48_8_;
      if (*piVar2 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            local_88._40_8_ = uVar11;
            local_88._48_8_ = uVar12;
            free(local_118.data);
            uVar13 = local_88._40_8_;
            uVar14 = local_88._48_8_;
          }
        }
        else {
          local_88._40_8_ = uVar11;
          local_88._48_8_ = uVar12;
          (**(code **)(*(long *)local_118.allocator + 0x18))();
          uVar13 = local_88._40_8_;
          uVar14 = local_88._48_8_;
        }
      }
    }
    local_88._48_8_ = uVar14;
    local_88._40_8_ = uVar13;
    ncnn::Dropout::forward_inplace(this,&local_88,&local_d8);
  }
  else {
    ncnn::Layer::forward((Layer *)this,a,&local_88,&local_d8);
  }
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.c = 0;
  local_118.cstep = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.c = 0;
  local_168.cstep = 0;
  if (local_d8.use_packing_layout == true) {
    ncnn::convert_packing(a,&local_168,4,&local_d8);
  }
  else if (&local_168 != a) {
    piVar2 = a->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    local_168.data = a->data;
    local_168.refcount._0_4_ = SUB84(a->refcount,0);
    local_168.refcount._4_4_ = (undefined4)((ulong)a->refcount >> 0x20);
    local_168.elemsize._0_4_ = (undefined4)a->elemsize;
    local_168.elemsize._4_4_ = (undefined4)(a->elemsize >> 0x20);
    local_168.elempack = a->elempack;
    local_168.allocator = a->allocator;
    local_168.dims = a->dims;
    local_168.w = a->w;
    local_168.h = a->h;
    local_168.c = a->c;
    local_168.cstep = a->cstep;
  }
  uVar11 = local_168._40_8_;
  uVar12 = local_168._48_8_;
  if (local_d8.use_bf16_storage == true) {
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.c = 0;
    local_1a8.cstep = 0;
    ncnn::cast_float32_to_bfloat16(&local_168,&local_1a8,&local_d8);
    piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (**(code **)(*(long *)local_168.allocator + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    local_168.data = local_1a8.data;
    local_168.refcount._0_4_ = local_1a8.refcount._0_4_;
    local_168.refcount._4_4_ = local_1a8.refcount._4_4_;
    local_168.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
    local_168.elemsize._4_4_ = local_1a8.elemsize._4_4_;
    local_168.elempack = local_1a8.elempack;
    local_168.allocator = local_1a8.allocator;
    uVar13._0_4_ = local_1a8.dims;
    uVar13._4_4_ = local_1a8.w;
    local_168.dims = local_1a8.dims;
    local_168.w = local_1a8.w;
    uVar14._0_4_ = local_1a8.h;
    uVar14._4_4_ = local_1a8.c;
    local_168.h = local_1a8.h;
    local_168.c = local_1a8.c;
    local_168.cstep = local_1a8.cstep;
    uVar11 = uVar13;
    uVar12 = uVar14;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar11 = local_168._40_8_;
      uVar12 = local_168._48_8_;
      if (*piVar2 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if (local_1a8.data != (void *)0x0) {
            local_168._40_8_ = uVar13;
            local_168._48_8_ = uVar14;
            free(local_1a8.data);
            uVar11 = local_168._40_8_;
            uVar12 = local_168._48_8_;
          }
        }
        else {
          local_168._40_8_ = uVar13;
          local_168._48_8_ = uVar14;
          (**(code **)(*(long *)local_1a8.allocator + 0x18))();
          uVar11 = local_168._40_8_;
          uVar12 = local_168._48_8_;
        }
      }
    }
  }
  local_168._48_8_ = uVar12;
  local_168._40_8_ = uVar11;
  if ((this->super_Layer).support_inplace != true) {
    (*(this->super_Layer)._vptr_Layer[7])(this,&local_168,&local_118,&local_d8);
    goto LAB_00114cb3;
  }
  if (local_168.data == (void *)0x0) {
LAB_00114a84:
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount = (int *)0x0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.c = 0;
    local_1a8.cstep = 0;
  }
  else {
    lVar17 = (long)local_168.c;
    if (local_168.cstep * lVar17 == 0) goto LAB_00114a84;
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.c = 0;
    local_1a8.cstep = 0;
    iVar15 = local_168.h;
    if (local_168.dims == 3) {
      uVar18 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      local_1a8.data = (void *)0x0;
      local_1a8.elemsize._0_4_ = (undefined4)local_168.elemsize;
      local_1a8.elemsize._4_4_ = local_168.elemsize._4_4_;
      local_1a8.elempack = local_168.elempack;
      local_1a8.w = local_168.w;
      local_1a8.dims = 3;
      local_1a8.h = local_168.h;
      local_1a8.c = local_168.c;
      local_1a8.refcount = (int *)0x0;
      local_1a8.cstep = ((long)(iVar15 * local_168.w) * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
      lVar17 = local_1a8.cstep * lVar17;
      __dest = (void *)0x0;
      if (lVar17 != 0) {
        lVar17 = lVar17 * uVar18;
LAB_00114b5d:
        local_1a8.refcount._4_4_ = 0;
        local_1a8.refcount._0_4_ = 0;
        local_1a8.elempack = local_168.elempack;
        local_1a8.elemsize._4_4_ = local_168.elemsize._4_4_;
        local_1a8.elemsize._0_4_ = (undefined4)local_168.elemsize;
        local_1a8.data = (void *)0x0;
        uVar18 = lVar17 + 3U & 0xfffffffffffffffc;
        local_90 = (void *)0x0;
        iVar15 = posix_memalign(&local_90,0x10,uVar18 + 4);
        local_1a8.data = (void *)0x0;
        if (iVar15 == 0) {
          local_1a8.data = local_90;
        }
        local_1a8.refcount = (int *)((long)local_1a8.data + uVar18);
        *local_1a8.refcount = 1;
        __dest = local_90;
      }
    }
    else {
      if (local_168.dims == 2) {
        local_1a8.elempack = local_168.elempack;
        local_1a8.elemsize._0_4_ = (undefined4)local_168.elemsize;
        local_1a8.elemsize._4_4_ = local_168.elemsize._4_4_;
        local_1a8.w = local_168.w;
        local_1a8.dims = 2;
        local_1a8.c = 1;
        local_1a8.h = local_168.h;
        local_1a8.cstep = (size_t)(local_168.h * local_168.w);
        if (local_168.h * local_168.w != 0) {
LAB_00114aed:
          lVar17 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) *
                   local_1a8.cstep;
          goto LAB_00114b5d;
        }
      }
      else if (local_168.dims == 1) {
        local_1a8.cstep = (size_t)local_168.w;
        local_1a8.elemsize._0_4_ = (undefined4)local_168.elemsize;
        local_1a8.elemsize._4_4_ = local_168.elemsize._4_4_;
        local_1a8.elempack = local_168.elempack;
        local_1a8.w = local_168.w;
        local_1a8.dims = 1;
        local_1a8.h = 1;
        local_1a8.c = 1;
        if (local_1a8.cstep != 0) goto LAB_00114aed;
      }
      local_1a8.data = (void *)0x0;
      local_1a8.refcount = (int *)0x0;
      __dest = (void *)0x0;
    }
    if ((long)local_168.c * local_168.cstep != 0) {
      memcpy(__dest,local_168.data,
             (long)local_168.c * local_168.cstep *
             CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
    }
    if (local_1a8.refcount != (int *)0x0) {
      LOCK();
      *local_1a8.refcount = *local_1a8.refcount + 1;
      UNLOCK();
    }
  }
  piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (**(code **)(*(long *)local_118.allocator + 0x18))();
      }
    }
  }
  local_118.data = local_1a8.data;
  local_118.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
  local_118.elemsize._4_4_ = local_1a8.elemsize._4_4_;
  local_118.elempack = local_1a8.elempack;
  local_118.allocator = local_1a8.allocator;
  uVar7._0_4_ = local_1a8.dims;
  uVar7._4_4_ = local_1a8.w;
  local_118.dims = local_1a8.dims;
  local_118.w = local_1a8.w;
  uVar8._0_4_ = local_1a8.h;
  uVar8._4_4_ = local_1a8.c;
  local_118.h = local_1a8.h;
  local_118.c = local_1a8.c;
  local_118.cstep = local_1a8.cstep;
  uVar11 = uVar7;
  uVar12 = uVar8;
  local_118.refcount = local_1a8.refcount;
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + -1;
    UNLOCK();
    uVar11 = local_118._40_8_;
    uVar12 = local_118._48_8_;
    if (*local_1a8.refcount == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          local_118._40_8_ = uVar7;
          local_118._48_8_ = uVar8;
          free(local_1a8.data);
          uVar11 = local_118._40_8_;
          uVar12 = local_118._48_8_;
        }
      }
      else {
        local_118._40_8_ = uVar7;
        local_118._48_8_ = uVar8;
        (**(code **)(*(long *)local_1a8.allocator + 0x18))();
        uVar11 = local_118._40_8_;
        uVar12 = local_118._48_8_;
        local_118.refcount = local_118.refcount;
      }
    }
  }
  local_118._48_8_ = uVar12;
  local_118._40_8_ = uVar11;
  (*(this->super_Layer)._vptr_Layer[9])(this,&local_118,&local_d8);
LAB_00114cb3:
  uVar11 = local_118._40_8_;
  uVar12 = local_118._48_8_;
  piVar2 = local_118.refcount;
  if (local_d8.use_bf16_storage == true) {
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.c = 0;
    local_1a8.cstep = 0;
    ncnn::cast_bfloat16_to_float32(&local_118,&local_1a8,&local_d8);
    piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    if (local_118.refcount != (int *)0x0) {
      LOCK();
      *local_118.refcount = *local_118.refcount + -1;
      UNLOCK();
      if (*local_118.refcount == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (**(code **)(*(long *)local_118.allocator + 0x18))();
        }
      }
    }
    local_118.data = local_1a8.data;
    local_118.refcount._0_4_ = local_1a8.refcount._0_4_;
    local_118.refcount._4_4_ = local_1a8.refcount._4_4_;
    local_118.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
    local_118.elemsize._4_4_ = local_1a8.elemsize._4_4_;
    local_118.elempack = local_1a8.elempack;
    local_118.allocator = local_1a8.allocator;
    uVar9._0_4_ = local_1a8.dims;
    uVar9._4_4_ = local_1a8.w;
    local_118.dims = local_1a8.dims;
    local_118.w = local_1a8.w;
    uVar10._0_4_ = local_1a8.h;
    uVar10._4_4_ = local_1a8.c;
    local_118.h = local_1a8.h;
    local_118.c = local_1a8.c;
    local_118.cstep = local_1a8.cstep;
    uVar11 = uVar9;
    uVar12 = uVar10;
    piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (local_1a8.refcount != (int *)0x0) {
      LOCK();
      *local_1a8.refcount = *local_1a8.refcount + -1;
      UNLOCK();
      uVar11 = local_118._40_8_;
      uVar12 = local_118._48_8_;
      piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (*local_1a8.refcount == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          piVar2 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
          if (local_1a8.data != (void *)0x0) {
            local_118._40_8_ = uVar9;
            local_118._48_8_ = uVar10;
            free(local_1a8.data);
            piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
            uVar11 = local_118._40_8_;
            uVar12 = local_118._48_8_;
          }
        }
        else {
          local_118._40_8_ = uVar9;
          local_118._48_8_ = uVar10;
          (**(code **)(*(long *)local_1a8.allocator + 0x18))();
          uVar11 = local_118._40_8_;
          uVar12 = local_118._48_8_;
          piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        }
      }
    }
  }
  local_118._48_8_ = uVar12;
  local_118._40_8_ = uVar11;
  piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  local_118.refcount = piVar2;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (**(code **)(*(long *)local_168.allocator + 0x18))();
      }
    }
  }
  (*(this->super_Layer)._vptr_Layer[5])(this,&local_d8);
  (*(this->super_Layer)._vptr_Layer[1])(this);
  iVar15 = CompareMat(&local_88,&local_118,local_11c);
  if (iVar15 == 0) {
    iVar15 = 0;
    if (top_shape->dims == 0) {
      iVar15 = test_layer<ncnn::Dropout>
                         (local_a4,local_a0,local_98,&local_d8,a,&local_88,local_11c,func);
    }
  }
  else {
    test_layer<ncnn::Dropout>();
    iVar15 = -1;
  }
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (*local_118.refcount == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (**(code **)(*(long *)local_118.allocator + 0x18))();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (**(code **)(*(long *)local_88.allocator + 0x18))();
      }
    }
  }
  ncnn::ModelBin::~ModelBin(&local_40.super_ModelBin);
  return iVar15;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, const ncnn::Mat& top_shape = ncnn::Mat(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);
    ncnn::Option opt = _opt;

    if (func)
    {
        (*func)((T*)op);
    }

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (top_shape.dims)
    {
        op->bottom_shapes.resize(1);
        op->top_shapes.resize(1);
        op->bottom_shapes[0] = a;
        op->top_shapes[0] = top_shape;
    }

    op->load_param(pd);

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    ncnn::Mat b;
    if (op->support_inplace)
    {
        b = a.clone();
        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    ncnn::Mat c;
    {
        ncnn::Mat a4;
        if (opt.use_packing_layout)
        {
            ncnn::convert_packing(a, a4, 4, opt);
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat a_bf16;
            ncnn::cast_float32_to_bfloat16(a4, a_bf16, opt);
            a4 = a_bf16;
        }

        if (op->support_inplace)
        {
            c = a4.clone();
            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat c_fp32;
            ncnn::cast_bfloat16_to_float32(c, c_fp32, opt);
            c = c_fp32;
        }
    }

#if NCNN_VULKAN
    ncnn::Mat d;
    if (opt.use_vulkan_compute)
    {
        // pack
        ncnn::Mat a4;
        if (opt.use_shader_pack8)
        {
            ncnn::convert_packing(a, a4, 8, opt);
            if (a4.elempack != 8)
                ncnn::convert_packing(a, a4, 4, opt);
        }
        else
            ncnn::convert_packing(a, a4, 4, opt);

        // fp16
        ncnn::Mat a4_fp16;
        if (opt.use_fp16_storage || ((a4.elempack == 4 || a4.elempack == 8) && opt.use_fp16_packed))
        {
            ncnn::cast_float32_to_float16(a4, a4_fp16, opt);
        }
        else
        {
            a4_fp16 = a4;
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        ncnn::VkMat a4_fp16_gpu;
        cmd.record_upload(a4_fp16, a4_fp16_gpu, opt);

        ncnn::VkMat d4_fp16_gpu;
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        cmd.record_download(d4_fp16_gpu, d, opt);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shape.dims == 0)
        return test_layer<T>(typeindex, pd, weights, opt, a, b, epsilon, func);

    return 0;
}